

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_proc_topology(Integer g_a,Integer proc,Integer *subscript)

{
  short sVar1;
  int iVar2;
  global_array_t *pgVar3;
  long lVar4;
  char err_string [256];
  char acStack_138 [264];
  
  lVar4 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar4)) {
    sprintf(acStack_138,"%s: INVALID ARRAY HANDLE","nga_proc_topology");
    pnga_error(acStack_138,g_a);
  }
  if (GA[lVar4].actv == 0) {
    sprintf(acStack_138,"%s: ARRAY NOT ACTIVE","nga_proc_topology");
    pnga_error(acStack_138,g_a);
  }
  pgVar3 = GA;
  sVar1 = GA[lVar4].ndim;
  if (0 < (long)sVar1) {
    lVar4 = 0;
    do {
      iVar2 = pgVar3[g_a + 1000].nblock[lVar4];
      subscript[lVar4] = proc % (long)iVar2;
      lVar4 = lVar4 + 1;
      proc = proc / (long)iVar2;
    } while (sVar1 != lVar4);
  }
  return;
}

Assistant:

void pnga_proc_topology(Integer g_a, Integer proc, Integer* subscript)
{
Integer d, index, ndim, ga_handle = GA_OFFSET + g_a;

   ga_check_handleM(g_a, "nga_proc_topology");
   ndim = GA[ga_handle].ndim;

   index = proc;

   for(d=0; d<ndim; d++){
       subscript[d] = index% GA[ga_handle].nblock[d];
       index  /= GA[ga_handle].nblock[d];  
   }
}